

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void google::protobuf::internal::PackedFieldHelper<15>::
     Serialize<google::protobuf::io::CodedOutputStream>
               (void *field,FieldMetadata *md,CodedOutputStream *output)

{
  int iVar1;
  undefined8 in_RAX;
  int *piVar2;
  int index;
  RepeatedField<int> *array;
  uint32_t local_28;
  undefined4 local_24;
  
  if (*field != 0) {
    _local_28 = CONCAT44((int)((ulong)in_RAX >> 0x20),md->tag);
    PrimitiveTypeHelper<13>::Serialize(&local_28,output);
    _local_28 = CONCAT44(*(undefined4 *)((long)field + 0x10),local_28);
    PrimitiveTypeHelper<13>::Serialize(&local_24,output);
    if (0 < *field) {
      index = 0;
      do {
        piVar2 = RepeatedField<int>::Get((RepeatedField<int> *)field,index);
        iVar1 = *piVar2;
        piVar2 = (int *)output->cur_;
        if ((output->impl_).end_ <= piVar2) {
          piVar2 = (int *)io::EpsCopyOutputStream::EnsureSpaceFallback
                                    (&output->impl_,(uint8_t *)piVar2);
        }
        *piVar2 = iVar1;
        output->cur_ = (uint8_t *)(piVar2 + 1);
        index = index + 1;
      } while (index < *field);
    }
  }
  return;
}

Assistant:

inline bool RepeatedField<Element>::empty() const {
  return current_size_ == 0;
}